

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O3

void leccalc::checkinputfile(uint *samplesize,FILE *fin,aggreports *agg)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  ostream *poVar4;
  uint summaryset_id;
  uint stream_type;
  undefined1 local_30 [4];
  uint local_2c;
  
  local_2c = 0;
  sVar2 = fread(&local_2c,4,1,(FILE *)fin);
  uVar1 = local_2c;
  if ((sVar2 == 1) && ((local_2c & 0x3000000) == 0x3000000)) {
    sVar2 = fread(samplesize,4,1,(FILE *)fin);
    if (sVar2 == 1) {
      sVar2 = fread(local_30,4,1,(FILE *)fin);
      if (sVar2 == 1) {
        if (checkinputfile::firstFileRead == false) {
          aggreports::SetSampleSize(agg,*samplesize);
          checkinputfile::firstFileRead = true;
        }
        return;
      }
      poVar4 = (ostream *)&std::cerr;
      pcVar3 = "FATAL: Stream read error: summaryset_id\n";
    }
    else {
      poVar4 = (ostream *)&std::cerr;
      pcVar3 = "FATAL: Stream read error: samplesize\n";
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "FATAL:: Not a summarycalc stream invalid stream type: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1);
    pcVar3 = "\n";
  }
  std::operator<<(poVar4,pcVar3);
  exit(-1);
}

Assistant:

inline void checkinputfile(unsigned int& samplesize, FILE * fin,
				   aggreports &agg)
	{
		static bool firstFileRead = false;

		// read_stream_type()
		unsigned int stream_type = 0;
		size_t i = fread(&stream_type, sizeof(stream_type), 1, fin);
		if (i != 1 || isSummaryCalcStream(stream_type) != true) {
			std::cerr << "FATAL:: Not a summarycalc stream invalid stream type: " << stream_type << "\n";
			exit(-1);
		}

		// read_sample_size()
		i = fread(&samplesize, sizeof(samplesize), 1, fin);
		if (i != 1) {
			std::cerr << "FATAL: Stream read error: samplesize\n";
			exit(-1);
		}

		// read_summary_set_id()
		unsigned int summaryset_id;
		i = fread(&summaryset_id, sizeof(summaryset_id), 1, fin);
		if (i != 1) {
			std::cerr << "FATAL: Stream read error: summaryset_id\n";
			exit(-1);
		}

		if (firstFileRead) return;

		agg.SetSampleSize(samplesize);   // Extract sample size from first file
		firstFileRead = true;
	}